

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Segment::CopyAndMoveCuesBeforeClusters
          (Segment *this,IMkvReader *reader,IMkvWriter *writer)

{
  int32 iVar1;
  int iVar2;
  ulong uVar3;
  int64_t iVar4;
  IMkvWriter *writer_00;
  uint64 value;
  long lVar5;
  long *in_RDX;
  int64_t in_RSI;
  IMkvWriter *in_RDI;
  int64_t segment_size;
  int64_t pos;
  int64_t cluster_offset;
  IMkvWriter *dst;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar6;
  
  dst = in_RDI;
  uVar3 = (**(code **)(*in_RDX + 0x18))();
  if (((uVar3 & 1) == 0) || (((ulong)in_RDI[0x1e]._vptr_IMkvWriter & 1) != 0)) {
    bVar6 = false;
  }
  else {
    iVar4 = Cluster::size_position((Cluster *)*in_RDI[0x21]._vptr_IMkvWriter);
    iVar1 = GetUIntSize(0x1f43b675);
    writer_00 = (IMkvWriter *)(iVar4 - iVar1);
    bVar6 = ChunkedCopy((IMkvReader *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                        dst,in_RSI,(int64_t)in_RDX);
    if (bVar6) {
      MoveCuesBeforeClusters((Segment *)segment_size);
      bVar6 = Cues::Write((Cues *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),dst)
      ;
      if ((bVar6) && (bVar6 = SeekHead::Finalize((SeekHead *)this,(IMkvWriter *)reader), bVar6)) {
        bVar6 = ChunkedCopy((IMkvReader *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),dst,in_RSI
                            ,(int64_t)in_RDX);
        if (bVar6) {
          value = (**(code **)(*in_RDX + 8))();
          lVar5 = (**(code **)(*in_RDX + 8))();
          iVar1 = (int32)((ulong)(lVar5 - (long)in_RDI[299]._vptr_IMkvWriter) >> 0x20);
          iVar2 = (**(code **)(*in_RDX + 0x10))(in_RDX,in_RDI[300]._vptr_IMkvWriter);
          if (((iVar2 == 0) && (iVar1 = WriteUIntSize(writer_00,value,iVar1), iVar1 == 0)) &&
             (iVar2 = (**(code **)(*in_RDX + 0x10))(in_RDX,value), iVar2 == 0)) {
            bVar6 = true;
          }
          else {
            bVar6 = false;
          }
        }
        else {
          bVar6 = false;
        }
      }
      else {
        bVar6 = false;
      }
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool Segment::CopyAndMoveCuesBeforeClusters(mkvparser::IMkvReader* reader,
                                            IMkvWriter* writer) {
  if (!writer->Seekable() || chunking_)
    return false;
  const int64_t cluster_offset =
      cluster_list_[0]->size_position() - GetUIntSize(libwebm::kMkvCluster);

  // Copy the headers.
  if (!ChunkedCopy(reader, writer, 0, cluster_offset))
    return false;

  // Recompute cue positions and seek entries.
  MoveCuesBeforeClusters();

  // Write cues and seek entries.
  // TODO(vigneshv): As of now, it's safe to call seek_head_.Finalize() for the
  // second time with a different writer object. But the name Finalize() doesn't
  // indicate something we want to call more than once. So consider renaming it
  // to write() or some such.
  if (!cues_.Write(writer) || !seek_head_.Finalize(writer))
    return false;

  // Copy the Clusters.
  if (!ChunkedCopy(reader, writer, cluster_offset,
                   cluster_end_offset_ - cluster_offset))
    return false;

  // Update the Segment size in case the Cues size has changed.
  const int64_t pos = writer->Position();
  const int64_t segment_size = writer->Position() - payload_pos_;
  if (writer->Position(size_position_) ||
      WriteUIntSize(writer, segment_size, 8) || writer->Position(pos))
    return false;
  return true;
}